

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O1

void GEN_CS::gen_cs_example_dr<true>(cb_to_cs_adf *c,multi_ex *examples,label *cs_labels)

{
  float fVar1;
  uint uVar2;
  example *ec;
  bool bVar3;
  pointer ppeVar4;
  ulong uVar5;
  int known_index;
  wclass local_50;
  v_array<COST_SENSITIVE::wclass> *local_40;
  v_array<COST_SENSITIVE::wclass> *local_38;
  
  local_40 = &(c->pred_scores).costs;
  v_array<COST_SENSITIVE::wclass>::clear(local_40);
  local_38 = &cs_labels->costs;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar4) {
    uVar5 = 0;
    do {
      ec = ppeVar4[uVar5];
      if ((((ec->tag)._end != (ec->tag)._begin) ||
          ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin))
         || (bVar3 = CB::ec_is_example_header(ec), bVar3)) {
        local_50.x = 0.0;
        local_50.class_index = (uint32_t)uVar5;
        local_50.partial_prediction = 0.0;
        local_50.wap_value = 0.0;
        uVar2 = (c->known_cost).action;
        if (uVar5 == uVar2) {
          (c->known_cost).action = 0;
          local_50.x = CB_ALGS::get_cost_pred<true>
                                 (c->scorer,&c->known_cost,
                                  (examples->
                                  super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                                  .super__Vector_impl_data._M_start[uVar5],0,2);
          (c->known_cost).action = uVar2;
        }
        else {
          local_50.x = CB_ALGS::get_cost_pred<true>
                                 (c->scorer,(cb_class *)0x0,
                                  (examples->
                                  super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                                  .super__Vector_impl_data._M_start[uVar5],0,2);
        }
        v_array<COST_SENSITIVE::wclass>::push_back(local_40,&local_50);
        fVar1 = (c->known_cost).probability;
        if (((fVar1 != -1.0) || (NAN(fVar1))) && (uVar5 == (c->known_cost).action)) {
          local_50.x = ((c->known_cost).cost - local_50.x) / fVar1 + local_50.x;
        }
        v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_50);
      }
      uVar5 = uVar5 + 1;
      ppeVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar4 >> 3));
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs_adf& c, multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{  // size_t mysize = examples.size();
  c.pred_scores.costs.clear();
  
  cs_labels.costs.clear();
  for (size_t i = 0; i < examples.size(); i++)
  {
    if (CB_ALGS::example_is_newline_not_header(*examples[i]))
      continue;

    COST_SENSITIVE::wclass wc = {0., (uint32_t)i, 0., 0.};

    if (c.known_cost.action == i)
    {
      int known_index = c.known_cost.action;
      c.known_cost.action = 0;
      // get cost prediction for this label
      // num_actions should be 1 effectively.
      // my get_cost_pred function will use 1 for 'index-1+base'
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, &(c.known_cost), *(examples[i]), 0, 2);
      c.known_cost.action = known_index;
    }
    else
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, nullptr, *(examples[i]), 0, 2);

    c.pred_scores.costs.push_back(wc);  // done

    // add correction if we observed cost for this action and regressor is wrong
    if (c.known_cost.probability != -1 && c.known_cost.action == i)
      wc.x += (c.known_cost.cost - wc.x) / c.known_cost.probability;
    cs_labels.costs.push_back(wc);
  }
}